

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::Invert
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  uchar *puVar5;
  EVP_PKEY_CTX *src;
  uchar *puVar6;
  ulong uVar7;
  uchar *puVar8;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  bVar3 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in,out);
  uVar4 = (uint)bVar3;
  width = width * uVar4;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00120b28;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&width,&height,in,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00120b28;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar1 = out->_rowSize;
  if (height * uVar1 != 0) {
    puVar6 = out->_data + (ulong)(startXOut * uVar4) + (ulong)(startYOut * uVar1);
    puVar5 = puVar6 + height * uVar1;
    uVar2 = in->_rowSize;
    puVar8 = in->_data + (ulong)(startXIn * uVar4) + (ulong)(startYIn * uVar2);
    do {
      if ((ulong)width != 0) {
        uVar7 = 0;
        do {
          puVar6[uVar7] = ~puVar8[uVar7];
          uVar7 = uVar7 + 1;
        } while (width != uVar7);
      }
      puVar6 = puVar6 + uVar1;
      puVar8 = puVar8 + uVar2;
    } while (puVar6 != puVar5);
  }
  return;
}

Assistant:

void Invert( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                 uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        const uint8_t colorCount  = CommonColorCount( in, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++inX )
                (*outX) = ~(*inX);
        }
    }